

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void process_player_input_fire(tgestate_t *state,input_t input)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  ulong uVar4;
  doorindex_t *pdVar5;
  byte bVar6;
  long lVar7;
  
  switch(input) {
  case 10:
    pick_up_item(state);
    return;
  case 0xb:
    drop_item(state);
    return;
  case 0xc:
    bVar6 = state->items_held[0];
    break;
  default:
    goto switchD_00105f48_caseD_d;
  case 0xf:
    bVar6 = state->items_held[1];
  }
  uVar4 = (ulong)bVar6;
  if (uVar4 != 0xff) {
    (state->saved_mappos).pos16.w = state->vischars[0].mi.mappos.w;
    *(undefined4 *)&state->saved_mappos = *(undefined4 *)&state->vischars[0].mi.mappos;
    if ((0xe090UL >> (uVar4 & 0x3f) & 1) == 0) {
      switch(uVar4) {
      case 0:
        bVar6 = (state->hero_mappos).v;
        lVar7 = 0;
        break;
      case 1:
        if ((state->room_index == '2') && (iVar3 = get_roomdef(state,'2',2), iVar3 != 0xff)) {
          set_roomdef(state,'2',2,0xff);
          set_roomdef(state,'2',0x17,0);
          setup_room(state);
          choose_game_window_attributes(state);
          plot_interior_tiles(state);
          bVar6 = 0x66;
          if (state->morale < 0x66) {
            bVar6 = state->morale;
          }
          state->morale = bVar6 + 10;
          increase_score(state,'2');
          return;
        }
        return;
      case 2:
        pdVar5 = get_nearest_door(state);
        if (pdVar5 != (doorindex_t *)0x0) {
          state->ptr_to_door_being_lockpicked = pdVar5;
          state->player_locked_out_until = state->game_counter + 0xff;
          state->vischars[0].flags = '\x01';
          queue_message(state,message_PICKING_THE_LOCK);
          return;
        }
        return;
      case 3:
        if ((0xfb < (byte)((state->hero_mappos).u + 0x93)) &&
           (0xfd < (byte)((state->hero_mappos).v + 0xb5))) {
          if (state->vischars[0].mi.sprite != sprites + 0x16) {
            solitary(state);
            return;
          }
          bVar6 = 0x66;
          if (state->morale < 0x66) {
            bVar6 = state->morale;
          }
          state->morale = bVar6 + 10;
          increase_score(state,'2');
          state->vischars[0].room = '\0';
          state->IY = state->vischars;
          transition(state,&action_papers::outside_main_gate);
          return;
        }
        return;
      }
      do {
        if (((&walls[0xc].miny)[lVar7] <= bVar6) && (bVar6 < (&walls[0xc].maxy)[lVar7])) {
          bVar1 = (state->hero_mappos).u;
          if (bVar1 == (&walls[0xc].maxx)[lVar7]) {
            uVar2 = '\x04';
            goto LAB_001061f0;
          }
          if (bVar1 - 1 == (uint)(&walls[0xc].maxx)[lVar7]) {
            uVar2 = '\x06';
            goto LAB_001061f0;
          }
        }
        lVar7 = lVar7 + 6;
      } while ((char)lVar7 != '\x18');
      bVar1 = (state->hero_mappos).u;
      lVar7 = 0;
      do {
        if (((&walls[0x10].minx)[lVar7] <= bVar1) && (bVar1 < (&walls[0x10].maxx)[lVar7])) {
          if (bVar6 == (&walls[0x10].miny)[lVar7]) {
            uVar2 = '\x05';
LAB_001061f0:
            state->vischars[0].direction = uVar2;
            state->vischars[0].input = 0x80;
            state->vischars[0].flags = '\x02';
            state->vischars[0].mi.mappos.w = 0xc;
            state->vischars[0].mi.sprite = sprites + 2;
            state->player_locked_out_until = state->game_counter + '`';
            queue_message(state,message_CUTTING_THE_WIRE);
            return;
          }
          if (bVar6 - 1 == (uint)(&walls[0x10].miny)[lVar7]) {
            uVar2 = '\a';
            goto LAB_001061f0;
          }
        }
        lVar7 = lVar7 + 6;
        if ((char)lVar7 == '\x12') {
          return;
        }
      } while( true );
    }
  }
switchD_00105f48_caseD_d:
  return;
}

Assistant:

void process_player_input_fire(tgestate_t *state, input_t input)
{
  assert(state != NULL);

  switch (input)
  {
  case input_UP_FIRE:
    pick_up_item(state);
    break;
  case input_DOWN_FIRE:
    drop_item(state);
    break;
  case input_LEFT_FIRE:
    use_item_common(state, state->items_held[0]); /* Conv: Inlined. */
    break;
  case input_RIGHT_FIRE:
    use_item_common(state, state->items_held[1]); /* Conv: Inlined. */
    break;
  case input_FIRE:
  default:
    break;
  }

  return;
}